

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O3

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> * __thiscall
pstack::Procman::CoreProcess::addressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,CoreProcess *this)

{
  size_type *psVar1;
  size_t *psVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  mapped_type *this_00;
  Off *pOVar5;
  _Base_ptr p_Var6;
  long lVar7;
  Off OVar8;
  _Rb_tree_node_base *p_Var9;
  bool bVar10;
  undefined1 auVar11 [16];
  iterator pos;
  undefined1 local_190 [8];
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  entries;
  iterator __begin2;
  undefined1 local_e0 [16];
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  size_t local_b8;
  undefined1 local_b0 [8];
  set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
  flags;
  undefined1 local_78 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
  entry;
  vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *rv;
  
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&entries;
  entries._M_t._M_impl._0_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  entry.second.fileOff = (Off)this;
  FileEntries::FileEntries
            ((FileEntries *)local_b0,
             (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  pos.idx = 0;
  pos.arrayp = (ReaderArray<pstack::Procman::FileEntry,_42UL> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FileEntries::iterator::iterator
            ((iterator *)&entries._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (FileEntries *)local_b0,pos);
  if (__begin2.entriesIterator.arrayp !=
      *(ReaderArray<pstack::Procman::FileEntry,_42UL> **)(__begin2.cur.second.fileOff + 0x20)) {
    psVar1 = &entry.first._M_string_length;
    psVar2 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      FileEntries::iterator::fetch((iterator *)psVar2);
      local_78 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,__begin2.nameoff,
                 __begin2.cur.first._M_dataplus._M_p + __begin2.nameoff);
      entry.second.end = __begin2.cur.second.end;
      entry.first.field_2._8_8_ = __begin2.cur.first.field_2._8_8_;
      entry.second.start = __begin2.cur.second.start;
      this_00 = std::
                map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                              *)local_190,
                             (key_type_conflict *)(entry.first.field_2._M_local_buf + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&this_00->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      (this_00->second).fileOff = entry.second.end;
      (this_00->second).start = entry.first.field_2._8_8_;
      (this_00->second).end = entry.second.start;
      if (local_78 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_78,
                        CONCAT71(entry.first._M_string_length._1_7_,
                                 (undefined1)entry.first._M_string_length) + 1);
      }
      FileEntries::iterator::fetch((iterator *)psVar2);
      __begin2.entriesIterator.arrayp =
           (ReaderArray<pstack::Procman::FileEntry,_42UL> *)
           ((long)&(__begin2.entriesIterator.arrayp)->reader + 1);
      __begin2._8_8_ = __begin2.cur.first._M_dataplus._M_p + __begin2._8_8_ + 1;
      auVar3[0xf] = 0;
      auVar3._0_15_ = (undefined1  [15])__begin2._1_15_;
      __begin2._0_16_ = auVar3 << 8;
    } while (__begin2.entriesIterator.arrayp !=
             *(ReaderArray<pstack::Procman::FileEntry,_42UL> **)(__begin2.cur.second.fileOff + 0x20)
            );
  }
  if ((size_type *)__begin2.nameoff != &__begin2.cur.first._M_string_length) {
    operator_delete((void *)__begin2.nameoff,__begin2.cur.first._M_string_length + 1);
  }
  if (flags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if (flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
    operator_delete(flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0x418);
  }
  flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  if (flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar5 = (Off *)pstack::Elf::Object::getSegments
                            ((uint)*(undefined8 *)(entry.second.fileOff + 0x188));
  OVar8 = *pOVar5;
  entry.second.fileOff = pOVar5[1];
  if (OVar8 != entry.second.fileOff) {
    psVar2 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      p_Var9 = (_Rb_tree_node_base *)&entries;
      if (entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        p_Var6 = (_Base_ptr)entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        do {
          bVar10 = *(_Base_ptr *)(p_Var6 + 1) <= *(_Base_ptr *)(OVar8 + 0x10);
          if (!bVar10) {
            p_Var9 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar10];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      local_78 = (undefined1  [8])&entry.first._M_string_length;
      entry.first._M_dataplus._M_p = (pointer)0x0;
      entry.first._M_string_length._0_1_ = 0;
      if (p_Var9 != entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        lVar7 = std::_Rb_tree_decrement(p_Var9);
        if ((*(ulong *)(OVar8 + 0x10) <= *(ulong *)(lVar7 + 0x20)) &&
           (*(ulong *)(lVar7 + 0x50) <= *(ulong *)(OVar8 + 0x10) + *(long *)(OVar8 + 0x28))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar7 + 0x28));
        }
      }
      flags._M_t._M_impl._0_4_ = 0;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      uVar4 = *(uint *)(OVar8 + 4);
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((uVar4 & 2) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT44(entries._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,1);
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_b0,(Permission *)psVar2);
        uVar4 = *(uint *)(OVar8 + 4);
      }
      if ((uVar4 & 4) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             entries._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff00000000;
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_b0,(Permission *)psVar2);
        uVar4 = *(uint *)(OVar8 + 4);
      }
      if ((uVar4 & 1) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT44(entries._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,2);
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_b0,(Permission *)psVar2);
      }
      entries._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(OVar8 + 0x10);
      auVar11._8_4_ = (int)entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
      auVar11._0_8_ = entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
      auVar11._12_4_ = (int)(entries._M_t._M_impl.super__Rb_tree_header._M_node_count >> 0x20);
      lVar7 = entries._M_t._M_impl.super__Rb_tree_header._M_node_count + *(long *)(OVar8 + 0x20);
      __begin2._8_4_ = (int)lVar7;
      __begin2.entries = (FileEntries *)(auVar11._8_8_ + *(long *)(OVar8 + 0x28));
      __begin2._12_4_ = (int)((ulong)lVar7 >> 0x20);
      __begin2.nameoff = 0;
      __begin2.cur.first._M_dataplus._M_p = (pointer)0x0;
      __begin2.cur.first._M_string_length = 0;
      __begin2.cur.first.field_2._M_allocated_capacity = (size_type)&__begin2.cur.second;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__begin2.cur.first.field_2,local_78,
                 entry.first._M_dataplus._M_p + (long)local_78);
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)&__begin2.cur.second.fileOff,
                 (_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)local_b0);
      local_e0 = (undefined1  [16])0x0;
      local_d0 = (_Base_ptr)0x0;
      local_c8 = (_Base_ptr)(local_e0 + 8);
      local_b8 = 0;
      local_c0 = local_c8;
      std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
      emplace_back<pstack::Procman::AddressRange>(__return_storage_ptr__,(AddressRange *)psVar2);
      std::
      _Rb_tree<pstack::Procman::AddressRange::VmFlag,_pstack::Procman::AddressRange::VmFlag,_std::_Identity<pstack::Procman::AddressRange::VmFlag>,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
      ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::VmFlag,_pstack::Procman::AddressRange::VmFlag,_std::_Identity<pstack::Procman::AddressRange::VmFlag>,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
                   *)local_e0);
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                   *)&__begin2.cur.second.fileOff);
      if ((FileEntry *)__begin2.cur.first.field_2._M_allocated_capacity != &__begin2.cur.second) {
        operator_delete((void *)__begin2.cur.first.field_2._M_allocated_capacity,
                        __begin2.cur.second.start + 1);
      }
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                   *)local_b0);
      if (local_78 != (undefined1  [8])&entry.first._M_string_length) {
        operator_delete((void *)local_78,
                        CONCAT71(entry.first._M_string_length._1_7_,
                                 (undefined1)entry.first._M_string_length) + 1);
      }
      OVar8 = OVar8 + 0x38;
    } while (OVar8 != entry.second.fileOff);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
               *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AddressRange>
CoreProcess::addressSpace() const {
    // First, go through the NT_FILE note if we have one - that gives us filenames
    std::map<Elf::Off, std::pair<std::string, FileEntry>> entries;
    for (auto entry : FileEntries(*coreImage))
        entries[entry.second.start] = entry;

    // Now go through the PT_LOAD segments in the core to generate the result.
    std::vector<AddressRange> rv;
    for (const auto &hdr : coreImage->getSegments(PT_LOAD)) {
        auto ub = entries.upper_bound(hdr.p_vaddr);
        std::string name;
        if (ub != entries.begin()) {
            --ub;
            if (ub->first >= hdr.p_vaddr && ub->second.second.end <= hdr.p_vaddr + hdr.p_memsz)
                name = ub->second.first;
        }
        std::set<AddressRange::Permission> flags;
        if ((hdr.p_flags & PF_W) != 0)
           flags.insert(AddressRange::Permission::write);
        if ((hdr.p_flags & PF_R) != 0)
           flags.insert(AddressRange::Permission::read);
        if ((hdr.p_flags & PF_X) != 0)
           flags.insert(AddressRange::Permission::exec);
        rv.push_back( { hdr.p_vaddr, hdr.p_vaddr + hdr.p_memsz,
                hdr.p_vaddr + hdr.p_filesz, 0, {0, 0, 0, name}, flags, {}});
    }
    return rv;
}